

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O3

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::matrixMetric(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *__return_storage_ptr__,
              SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,int type)

{
  undefined1 (*pauVar1) [16];
  uint *puVar2;
  fpclass_type fVar3;
  pointer pnVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  cpp_dec_float<50U,_int,_void> *pcVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  cpp_dec_float<50U,_int,_void> local_138;
  cpp_dec_float<50U,_int,_void> local_f8;
  cpp_dec_float<50U,_int,_void> local_b8;
  cpp_dec_float<50U,_int,_void> local_78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  
  local_78.fpclass = cpp_dec_float_finite;
  local_78.prec_elem = 10;
  local_78.data._M_elems[0] = 0;
  local_78.data._M_elems[1] = 0;
  local_78.data._M_elems[2] = 0;
  local_78.data._M_elems[3] = 0;
  local_78.data._M_elems[4] = 0;
  local_78.data._M_elems[5] = 0;
  local_78.data._M_elems._24_5_ = 0;
  local_78.data._M_elems[7]._1_3_ = 0;
  local_78.data._M_elems._32_5_ = 0;
  local_78.data._M_elems[9]._1_3_ = 0;
  local_78.exp = 0;
  local_78.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_78,0.0);
  iVar9 = (*(this->
            super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SLinSolver[4])(this);
  local_38 = __return_storage_ptr__;
  if (iVar9 == 0) {
    (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
    (__return_storage_ptr__->m_backend).prec_elem = 10;
    (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
    *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x1d) = 0;
    *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x25) = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)__return_storage_ptr__,1.0);
  }
  else {
    if (type == 2) {
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_78,1.0);
      iVar9 = (*(this->
                super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._vptr_SLinSolver[4])(this);
      if (0 < iVar9) {
        lVar10 = 0;
        lVar11 = 0;
        do {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&local_78,
                     (cpp_dec_float<50U,_int,_void> *)
                     ((long)(((this->
                              super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).diag.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar10));
          lVar11 = lVar11 + 1;
          iVar9 = (*(this->
                    super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    )._vptr_SLinSolver[4])(this);
          lVar10 = lVar10 + 0x38;
        } while (lVar11 < iVar9);
      }
      local_138.fpclass = cpp_dec_float_finite;
      local_138.prec_elem = 10;
      local_138.data._M_elems[0] = 0;
      local_138.data._M_elems[1] = 0;
      local_138.data._M_elems[2] = 0;
      local_138.data._M_elems[3] = 0;
      local_138.data._M_elems[4] = 0;
      local_138.data._M_elems[5] = 0;
      local_138.data._M_elems[6] = 0;
      local_138.data._M_elems[7] = 0;
      local_138.data._M_elems._32_5_ = 0;
      local_138.data._M_elems[9]._1_3_ = 0;
      local_138.exp = 0;
      local_138.neg = false;
      local_f8.fpclass = cpp_dec_float_finite;
      local_f8.prec_elem = 10;
      local_f8.data._M_elems[0] = 0;
      local_f8.data._M_elems[1] = 0;
      local_f8.data._M_elems[2] = 0;
      local_f8.data._M_elems[3] = 0;
      local_f8.data._M_elems[4] = 0;
      local_f8.data._M_elems[5] = 0;
      local_f8.data._M_elems._24_5_ = 0;
      local_f8.data._M_elems[7]._1_3_ = 0;
      local_f8.data._M_elems._32_5_ = 0;
      local_f8.data._M_elems[9]._1_3_ = 0;
      local_f8.exp = 0;
      local_f8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_f8,1.0);
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_138,&local_f8,&local_78);
      local_78.data._M_elems[0] = local_138.data._M_elems[0];
      local_78.data._M_elems[1] = local_138.data._M_elems[1];
      local_78.data._M_elems[2] = local_138.data._M_elems[2];
      local_78.data._M_elems[3] = local_138.data._M_elems[3];
      local_78.data._M_elems[4] = local_138.data._M_elems[4];
      local_78.data._M_elems[5] = local_138.data._M_elems[5];
      local_78.data._M_elems._24_5_ =
           SUB85(CONCAT44(local_138.data._M_elems[7],local_138.data._M_elems[6]),0);
      local_78.data._M_elems[7]._1_3_ = (undefined3)(local_138.data._M_elems[7] >> 8);
      local_78.data._M_elems._32_5_ = local_138.data._M_elems._32_5_;
      local_78.data._M_elems[9]._1_3_ = local_138.data._M_elems[9]._1_3_;
      local_78.exp = local_138.exp;
      local_78.neg = local_138.neg;
      local_78.fpclass = local_138.fpclass;
      local_78.prec_elem = local_138.prec_elem;
    }
    else if (type == 1) {
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_78,0.0);
      iVar9 = (*(this->
                super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._vptr_SLinSolver[4])(this);
      if (0 < iVar9) {
        lVar10 = 0;
        lVar11 = 0;
        do {
          pnVar4 = (this->
                   super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).diag.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_138.fpclass = cpp_dec_float_finite;
          local_138.prec_elem = 10;
          local_138.data._M_elems[0] = 0;
          local_138.data._M_elems[1] = 0;
          local_138.data._M_elems[2] = 0;
          local_138.data._M_elems[3] = 0;
          local_138.data._M_elems[4] = 0;
          local_138.data._M_elems[5] = 0;
          local_138.data._M_elems[6] = 0;
          local_138.data._M_elems[7] = 0;
          local_138.data._M_elems._32_5_ = 0;
          local_138.data._M_elems[9]._1_3_ = 0;
          local_138.exp = 0;
          local_138.neg = false;
          local_f8.fpclass = cpp_dec_float_finite;
          local_f8.prec_elem = 10;
          local_f8.data._M_elems[0] = 0;
          local_f8.data._M_elems[1] = 0;
          local_f8.data._M_elems[2] = 0;
          local_f8.data._M_elems[3] = 0;
          local_f8.data._M_elems[4] = 0;
          local_f8.data._M_elems[5] = 0;
          local_f8.data._M_elems._24_5_ = 0;
          local_f8.data._M_elems[7]._1_3_ = 0;
          local_f8.data._M_elems._32_5_ = 0;
          local_f8.data._M_elems[9]._1_3_ = 0;
          local_f8.exp = 0;
          local_f8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_f8,1.0);
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_138,&local_f8,
                     (cpp_dec_float<50U,_int,_void> *)
                     ((long)(pnVar4->m_backend).data._M_elems + lVar10));
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&local_78,&local_138);
          lVar11 = lVar11 + 1;
          iVar9 = (*(this->
                    super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    )._vptr_SLinSolver[4])(this);
          lVar10 = lVar10 + 0x38;
        } while (lVar11 < iVar9);
      }
    }
    else if (type == 0) {
      pnVar4 = (this->
               super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).diag.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_138.exp = (pnVar4->m_backend).exp;
      local_138.neg = (pnVar4->m_backend).neg;
      fVar3 = (pnVar4->m_backend).fpclass;
      local_138.fpclass = (pnVar4->m_backend).fpclass;
      local_138.prec_elem = (pnVar4->m_backend).prec_elem;
      local_f8.fpclass = (pnVar4->m_backend).fpclass;
      local_f8.prec_elem = (pnVar4->m_backend).prec_elem;
      local_f8.data._M_elems._0_8_ = *(undefined8 *)(pnVar4->m_backend).data._M_elems;
      local_f8.data._M_elems._8_8_ = *(undefined8 *)((pnVar4->m_backend).data._M_elems + 2);
      local_f8.data._M_elems._16_8_ = *(undefined8 *)((pnVar4->m_backend).data._M_elems + 4);
      uVar6 = *(undefined8 *)((pnVar4->m_backend).data._M_elems + 6);
      uVar5 = *(undefined8 *)((pnVar4->m_backend).data._M_elems + 8);
      local_f8.data._M_elems._32_5_ = SUB85(uVar5,0);
      local_f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
      local_f8.data._M_elems._24_5_ = SUB85(uVar6,0);
      local_f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_f8.neg = local_138.neg;
      if ((local_138.neg == true) &&
         (local_f8.data._M_elems[0] != 0 || fVar3 != cpp_dec_float_finite)) {
        local_f8.neg = false;
      }
      local_138.data._M_elems._0_8_ = *(undefined8 *)(pnVar4->m_backend).data._M_elems;
      local_138.data._M_elems._8_8_ = *(undefined8 *)((pnVar4->m_backend).data._M_elems + 2);
      local_138.data._M_elems._16_8_ = *(undefined8 *)((pnVar4->m_backend).data._M_elems + 4);
      local_138.data._M_elems[6] = (pnVar4->m_backend).data._M_elems[6];
      local_138.data._M_elems[7] = (pnVar4->m_backend).data._M_elems[7];
      uVar5 = *(undefined8 *)((pnVar4->m_backend).data._M_elems + 8);
      local_138.data._M_elems._32_5_ = SUB85(uVar5,0);
      local_138.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
      if ((local_138.neg != false) &&
         (fVar3 != cpp_dec_float_finite || local_138.data._M_elems[0] != 0)) {
        local_138.neg = (bool)(local_138.neg ^ 1);
      }
      local_f8.exp = local_138.exp;
      iVar9 = (*(this->
                super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._vptr_SLinSolver[4])(this);
      if (1 < iVar9) {
        lVar10 = 1;
        lVar11 = 0x68;
        do {
          pnVar4 = (this->
                   super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).diag.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_b8.exp = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar11 + -8);
          local_b8.neg = *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar11 + -4);
          local_b8._48_8_ = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar11);
          pauVar1 = (undefined1 (*) [16])((long)(pnVar4->m_backend).data._M_elems + lVar11 + -0x30);
          auVar7 = *pauVar1;
          puVar2 = (uint *)((long)(pnVar4->m_backend).data._M_elems + lVar11 + -0x20);
          local_b8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
          uVar5 = *(undefined8 *)(puVar2 + 2);
          local_b8.data._M_elems._32_8_ =
               *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar11 + -0x10);
          local_b8.data._M_elems._24_5_ = SUB85(uVar5,0);
          local_b8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
          if ((local_b8.neg == true) &&
             (local_b8.data._M_elems[0] = (uint)*(undefined8 *)*pauVar1,
             local_b8.fpclass != cpp_dec_float_finite || local_b8.data._M_elems[0] != 0)) {
            local_b8.neg = false;
          }
          local_b8.data._M_elems._0_16_ = auVar7;
          if ((local_b8.fpclass == cpp_dec_float_NaN) || (local_f8.fpclass == cpp_dec_float_NaN)) {
LAB_0029df89:
            if (((local_b8.fpclass != cpp_dec_float_NaN) && (local_138.fpclass != cpp_dec_float_NaN)
                ) && (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              compare(&local_b8,&local_138),
                     auVar7 = (undefined1  [16])local_b8.data._M_elems._0_16_, 0 < iVar9)) {
              local_138.data._M_elems._32_5_ = local_b8.data._M_elems._32_5_;
              local_138.data._M_elems[9]._1_3_ = local_b8.data._M_elems[9]._1_3_;
              local_138.data._M_elems[4] = local_b8.data._M_elems[4];
              local_138.data._M_elems[5] = local_b8.data._M_elems[5];
              local_138.data._M_elems[6] = local_b8.data._M_elems[6];
              local_138.data._M_elems[7] =
                   (uint)(CONCAT35(local_b8.data._M_elems[7]._1_3_,local_b8.data._M_elems._24_5_) >>
                         0x20);
              local_138.data._M_elems[0] = local_b8.data._M_elems[0];
              local_138.data._M_elems[1] = local_b8.data._M_elems[1];
              local_138.data._M_elems[2] = local_b8.data._M_elems[2];
              local_138.data._M_elems[3] = local_b8.data._M_elems[3];
              local_138.exp = local_b8.exp;
              local_138.neg = local_b8.neg;
              local_138.fpclass = local_b8.fpclass;
              local_b8.data._M_elems._0_16_ = auVar7;
              pcVar8 = &local_138;
              goto LAB_0029e046;
            }
          }
          else {
            iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_b8,&local_f8);
            auVar7 = (undefined1  [16])local_b8.data._M_elems._0_16_;
            if (-1 < iVar9) goto LAB_0029df89;
            local_f8.data._M_elems._32_5_ = local_b8.data._M_elems._32_5_;
            local_f8.data._M_elems[9]._1_3_ = local_b8.data._M_elems[9]._1_3_;
            local_f8.data._M_elems[4] = local_b8.data._M_elems[4];
            local_f8.data._M_elems[5] = local_b8.data._M_elems[5];
            local_f8.data._M_elems._24_5_ = local_b8.data._M_elems._24_5_;
            local_f8.data._M_elems[7]._1_3_ = local_b8.data._M_elems[7]._1_3_;
            local_f8.data._M_elems[0] = local_b8.data._M_elems[0];
            local_f8.data._M_elems[1] = local_b8.data._M_elems[1];
            local_f8.data._M_elems[2] = local_b8.data._M_elems[2];
            local_f8.data._M_elems[3] = local_b8.data._M_elems[3];
            local_f8.exp = local_b8.exp;
            local_f8.neg = local_b8.neg;
            local_f8.fpclass = local_b8.fpclass;
            local_b8.data._M_elems._0_16_ = auVar7;
            pcVar8 = &local_f8;
LAB_0029e046:
            pcVar8->prec_elem = local_b8.prec_elem;
          }
          lVar10 = lVar10 + 1;
          iVar9 = (*(this->
                    super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    )._vptr_SLinSolver[4])(this);
          lVar11 = lVar11 + 0x38;
        } while (lVar10 < iVar9);
      }
      local_b8.fpclass = cpp_dec_float_finite;
      local_b8.prec_elem = 10;
      local_b8.data._M_elems[0] = 0;
      local_b8.data._M_elems[1] = 0;
      local_b8.data._M_elems[2] = 0;
      local_b8.data._M_elems[3] = 0;
      local_b8.data._M_elems[4] = 0;
      local_b8.data._M_elems[5] = 0;
      local_b8.data._M_elems._24_5_ = 0;
      local_b8.data._M_elems[7]._1_3_ = 0;
      local_b8.data._M_elems[8] = 0;
      local_b8.data._M_elems[9] = 0;
      local_b8.exp = 0;
      local_b8.neg = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_b8,&local_138,&local_f8);
      local_78.data._M_elems._32_5_ = local_b8.data._M_elems._32_5_;
      local_78.data._M_elems[9]._1_3_ = local_b8.data._M_elems[9]._1_3_;
      local_78.data._M_elems[4] = local_b8.data._M_elems[4];
      local_78.data._M_elems[5] = local_b8.data._M_elems[5];
      local_78.data._M_elems._24_5_ = local_b8.data._M_elems._24_5_;
      local_78.data._M_elems[7]._1_3_ = local_b8.data._M_elems[7]._1_3_;
      local_78.data._M_elems[0] = local_b8.data._M_elems[0];
      local_78.data._M_elems[1] = local_b8.data._M_elems[1];
      local_78.data._M_elems[2] = local_b8.data._M_elems[2];
      local_78.data._M_elems[3] = local_b8.data._M_elems[3];
      local_78.exp = local_b8.exp;
      local_78.neg = local_b8.neg;
      local_78.fpclass = local_b8.fpclass;
      local_78.prec_elem = local_b8.prec_elem;
    }
    *(ulong *)((local_38->m_backend).data._M_elems + 8) =
         CONCAT35(local_78.data._M_elems[9]._1_3_,local_78.data._M_elems._32_5_);
    *(undefined8 *)((local_38->m_backend).data._M_elems + 4) = local_78.data._M_elems._16_8_;
    *(ulong *)((local_38->m_backend).data._M_elems + 6) =
         CONCAT35(local_78.data._M_elems[7]._1_3_,local_78.data._M_elems._24_5_);
    *(undefined8 *)(local_38->m_backend).data._M_elems = local_78.data._M_elems._0_8_;
    *(undefined8 *)((local_38->m_backend).data._M_elems + 2) = local_78.data._M_elems._8_8_;
    (local_38->m_backend).exp = local_78.exp;
    (local_38->m_backend).neg = local_78.neg;
    (local_38->m_backend).fpclass = local_78.fpclass;
    (local_38->m_backend).prec_elem = local_78.prec_elem;
  }
  return local_38;
}

Assistant:

R SLUFactor<R>::matrixMetric(int type) const
{
   R result = 0.0;

   // catch corner case of empty matrix
   if(dim() == 0)
      return 1.0;

   switch(type)
   {
   // compute condition estimate by ratio of max/min of elements on the diagonal
   case 0:
   {
      R mindiag = spxAbs(this->diag[0]);
      R maxdiag = spxAbs(this->diag[0]);

      for(int i = 1; i < dim(); ++i)
      {
         R absdiag = spxAbs(this->diag[i]);

         if(absdiag < mindiag)
            mindiag = absdiag;
         else if(absdiag > maxdiag)
            maxdiag = absdiag;
      }

      result = maxdiag / mindiag;
      break;
   }

   // compute sum of inverses of all elements on the diagonal
   case 1:
      result = 0.0;

      for(int i = 0; i < dim(); ++i)
         result += 1.0 / this->diag[i];

      break;

   // compute determinant (product of all diagonal elements of U)
   case 2:
      result = 1.0;

      for(int i = 0; i < dim(); ++i)
         result *= this->diag[i];

      result = 1.0 / result;
      break;
   }

   return result;
}